

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O3

void Fweb(sunrealtype tcalc,N_Vector cc,N_Vector crate,UserData webdata)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  sunrealtype **ppsVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  sunrealtype temp;
  double dVar21;
  
  lVar6 = 0;
  lVar7 = 0;
  do {
    dVar18 = (double)lVar7 * webdata->dy;
    lVar9 = 0x28;
    if (lVar7 == 0x13) {
      lVar9 = -0x28;
    }
    lVar10 = -0x28;
    if (lVar7 == 0) {
      lVar10 = 0x28;
    }
    lVar17 = 0;
    lVar12 = lVar6;
    do {
      dVar19 = webdata->dx;
      lVar14 = *(long *)((long)cc->content + 0x10);
      lVar1 = lVar7 * 0x28 + lVar17 * 2;
      pdVar2 = (double *)(lVar14 + lVar1 * 8);
      pdVar8 = (double *)(lVar1 * 8 + *(long *)((long)webdata->rates->content + 0x10));
      lVar3 = *(long *)((long)crate->content + 0x10);
      ppsVar4 = webdata->acoef;
      lVar13 = 0;
      bVar5 = true;
      do {
        bVar11 = bVar5;
        dVar21 = 0.0;
        lVar15 = 0;
        bVar5 = true;
        do {
          bVar16 = bVar5;
          dVar21 = dVar21 + *(double *)(lVar14 + lVar12 + lVar15) *
                            *(double *)((long)ppsVar4[lVar13] + lVar15);
          lVar15 = lVar15 + 8;
          bVar5 = false;
        } while (bVar16);
        pdVar8[lVar13] = dVar21;
        lVar13 = 1;
        bVar5 = false;
      } while (bVar11);
      dVar19 = dVar19 * (double)lVar17;
      dVar21 = sin(dVar19 * 12.5663706143592);
      dVar20 = sin(dVar18 * 12.5663706143592);
      dVar19 = dVar20 * dVar21 * 1000.0 + dVar19 * 50.0 * dVar18 + 1.0;
      *pdVar8 = (webdata->bcoef[0] * dVar19 + *pdVar8) * *pdVar2;
      pdVar8[1] = (dVar19 * webdata->bcoef[1] + pdVar8[1]) * pdVar2[1];
      lVar14 = 0;
      bVar5 = true;
      do {
        bVar11 = bVar5;
        dVar19 = pdVar2[lVar14];
        *(double *)(lVar3 + lVar1 * 8 + lVar14 * 8) =
             ((pdVar2[lVar9 + lVar14] - dVar19) - (dVar19 - pdVar2[lVar10 + lVar14])) *
             webdata->coy[lVar14] +
             ((pdVar2[(ulong)(lVar17 != 0x13) * 4 + lVar14 + -2] - dVar19) -
             (dVar19 - pdVar2[(ulong)(lVar17 == 0) * 4 + lVar14 + -2])) * webdata->cox[lVar14] +
             pdVar8[lVar14];
        lVar14 = 1;
        bVar5 = false;
      } while (bVar11);
      lVar17 = lVar17 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar17 != 0x14);
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x140;
  } while (lVar7 != 0x14);
  return;
}

Assistant:

static void Fweb(sunrealtype tcalc, N_Vector cc, N_Vector crate, UserData webdata)
{
  sunindextype jx, jy, is, idyu, idyl, idxu, idxl;
  sunrealtype xx, yy, *cxy, *ratesxy, *cratexy, dcyli, dcyui, dcxli, dcxui;

  /* Loop over grid points, evaluate interaction vector (length ns),
     form diffusion difference terms, and load crate.                    */

  for (jy = 0; jy < MY; jy++)
  {
    yy   = (webdata->dy) * jy;
    idyu = (jy != MY - 1) ? NSMX : -NSMX;
    idyl = (jy != 0) ? NSMX : -NSMX;

    for (jx = 0; jx < MX; jx++)
    {
      xx      = (webdata->dx) * jx;
      idxu    = (jx != MX - 1) ? NUM_SPECIES : -NUM_SPECIES;
      idxl    = (jx != 0) ? NUM_SPECIES : -NUM_SPECIES;
      cxy     = IJ_Vptr(cc, jx, jy);
      ratesxy = IJ_Vptr(webdata->rates, jx, jy);
      cratexy = IJ_Vptr(crate, jx, jy);

      /* Get interaction vector at this grid point. */
      WebRates(xx, yy, cxy, ratesxy, webdata);

      /* Loop over species, do differencing, load crate segment. */
      for (is = 0; is < NUM_SPECIES; is++)
      {
        /* Differencing in y. */
        dcyli = *(cxy + is) - *(cxy - idyl + is);
        dcyui = *(cxy + idyu + is) - *(cxy + is);

        /* Differencing in x. */
        dcxli = *(cxy + is) - *(cxy - idxl + is);
        dcxui = *(cxy + idxu + is) - *(cxy + is);

        /* Compute the crate values at (xx,yy). */
        cratexy[is] = coy[is] * (dcyui - dcyli) + cox[is] * (dcxui - dcxli) +
                      ratesxy[is];

      } /* End is loop */
    }   /* End of jx loop */
  }     /* End of jy loop */
}